

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O1

void __thiscall
InterpreterTestSuite_PC_BorderagentGetLocator_Test::TestBody
          (InterpreterTestSuite_PC_BorderagentGetLocator_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  element_type *peVar3;
  bool bVar4;
  TypedExpectation<ot::commissioner::Error_(unsigned_short_&)> *this_00;
  char *in_R9;
  Expression expr;
  AssertionResult gtest_ar_;
  Value value;
  TestContext ctx;
  Expression local_268;
  Matcher<unsigned_short_&> local_248;
  AssertHelper local_230;
  Expression local_228;
  undefined1 local_210 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  _Alloc_hider local_1e8;
  char local_1d8 [16];
  undefined1 local_1c8 [8];
  _Alloc_hider local_1c0;
  element_type *local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  _Alloc_hider local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  Error local_180;
  TestContext local_158;
  
  InterpreterTestSuite::TestContext::TestContext(&local_158);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&local_158);
  local_248.super_MatcherBase<unsigned_short_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)operator_new(8);
  ((local_248.super_MatcherBase<unsigned_short_&>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_003a60c0;
  local_248.super_MatcherBase<unsigned_short_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a10c0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<unsigned_short&>const*>
            (&local_248.super_MatcherBase<unsigned_short_&>.impl_.
              super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             local_248.super_MatcherBase<unsigned_short_&>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  local_248.super_MatcherBase<unsigned_short_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a1078;
  CommissionerAppMock::gmock_GetBorderAgentLocator
            ((MockSpec<ot::commissioner::Error_(unsigned_short_&)> *)local_1c8,
             local_158.mDefaultCommissionerObject.
             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_248);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<ot::commissioner::Error_(unsigned_short_&)>::
            InternalExpectedAt((MockSpec<ot::commissioner::Error_(unsigned_short_&)> *)local_1c8,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                               ,0x6d3,"*ctx.mDefaultCommissionerObject","GetBorderAgentLocator(_)");
  paVar1 = &local_180.mMessage.field_2;
  local_180.mCode = kNone;
  local_180.mMessage._M_string_length = 0;
  local_180.mMessage.field_2._M_local_buf[0] = '\0';
  local_180.mMessage._M_dataplus._M_p = (pointer)paVar1;
  testing::Return<ot::commissioner::Error>((testing *)&local_268,&local_180);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::Error_(unsigned_short_&)> *)local_210,
             (ReturnAction *)&local_268);
  testing::internal::TypedExpectation<ot::commissioner::Error_(unsigned_short_&)>::WillOnce
            (this_00,(Action<ot::commissioner::Error_(unsigned_short_&)> *)local_210);
  if ((_Manager_type)local_200._M_allocated_capacity != (_Manager_type)0x0) {
    (*(code *)local_200._M_allocated_capacity)(local_210,local_210,3);
  }
  if (local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_268.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_180.mMessage._M_dataplus._M_p);
  }
  local_1c0._M_p = (pointer)&PTR__MatcherBase_003a10c0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]));
  }
  local_248.super_MatcherBase<unsigned_short_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a10c0;
  if (local_248.super_MatcherBase<unsigned_short_&>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super_MatcherBase<unsigned_short_&>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8._0_4_ = kNone;
  local_1b8 = (element_type *)0x0;
  local_1b0._M_local_buf[0] = '\0';
  local_198 = 0;
  local_190._M_local_buf[0] = '\0';
  local_210._0_8_ = &local_200;
  local_1c0._M_p = (pointer)&local_1b0;
  local_1a0._M_p = (pointer)&local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"borderagent get locator","");
  ot::commissioner::Interpreter::ParseExpression
            (&local_228,&local_158.mInterpreter,(string *)local_210);
  local_248.super_MatcherBase<unsigned_short_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_268.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_248.super_MatcherBase<unsigned_short_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           local_268.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_248.super_MatcherBase<unsigned_short_&>._vptr_MatcherBase =
       (_func_int **)
       local_268.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_228.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_228.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_228.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._0_8_ != &local_200) {
    operator_delete((void *)local_210._0_8_);
  }
  ot::commissioner::Interpreter::Eval((Value *)local_210,&local_158.mInterpreter,&local_268);
  local_1c8._0_4_ = local_210._0_4_;
  std::__cxx11::string::operator=((string *)&local_1c0,(string *)(local_210 + 8));
  std::__cxx11::string::operator=((string *)&local_1a0,(string *)&local_1e8);
  if (local_1e8._M_p != local_1d8) {
    operator_delete(local_1e8._M_p);
  }
  if ((char *)local_210._8_8_ != local_200._M_local_buf + 8) {
    operator_delete((void *)local_210._8_8_);
  }
  bVar4 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_1c8);
  local_248.super_MatcherBase<unsigned_short_&>._vptr_MatcherBase =
       (_func_int **)
       CONCAT71(local_248.super_MatcherBase<unsigned_short_&>._vptr_MatcherBase._1_7_,bVar4);
  local_248.super_MatcherBase<unsigned_short_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_210,(internal *)&local_248,(AssertionResult *)0x2e6ffe,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x6da,(char *)local_210._0_8_);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._0_8_ != &local_200) {
      operator_delete((void *)local_210._0_8_);
    }
    if (local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(((local_228.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
    }
  }
  peVar3 = local_248.super_MatcherBase<unsigned_short_&>.impl_.
           super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (local_248.super_MatcherBase<unsigned_short_&>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    peVar2 = (element_type *)
             ((local_248.super_MatcherBase<unsigned_short_&>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
    if (peVar2 != local_248.super_MatcherBase<unsigned_short_&>.impl_.
                  super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr + 2) {
      operator_delete(peVar2);
    }
    operator_delete(peVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_p != &local_190) {
    operator_delete(local_1a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_p != &local_1b0) {
    operator_delete(local_1c0._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  InterpreterTestSuite::TestContext::~TestContext(&local_158);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BorderagentGetLocator)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetBorderAgentLocator(_)).WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("borderagent get locator");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}